

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall
AddrManImpl::AddrManImpl
          (AddrManImpl *this,NetGroupManager *netgroupman,bool deterministic,
          int32_t consistency_check_ratio)

{
  long lVar1;
  undefined4 in_ECX;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  nid_type *entry_1;
  nid_type *__end2_1;
  nid_type *__begin2_1;
  nid_type (*__range2_1) [64];
  nid_type (*bucket_1) [64];
  nid_type (*__end1_1) [64];
  nid_type (*__begin1_1) [64];
  nid_type (*__range1_1) [256] [64];
  nid_type *entry;
  nid_type *__end2;
  nid_type *__begin2;
  nid_type (*__range2) [64];
  nid_type (*bucket) [64];
  nid_type (*__end1) [64];
  nid_type (*__begin1) [64];
  nid_type (*__range1) [1024] [64];
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  *in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff07;
  FastRandomContext *in_stack_ffffffffffffff08;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffff28;
  undefined8 *local_a8;
  undefined8 *local_88;
  undefined8 *local_68;
  undefined8 *local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffef8);
  FastRandomContext::FastRandomContext(in_stack_ffffffffffffff08,(bool)in_stack_ffffffffffffff07);
  if ((in_DL & 1) == 0) {
    RandomMixin<FastRandomContext>::rand256(in_stack_ffffffffffffff28);
  }
  else {
    uint256::uint256((uint256 *)in_stack_fffffffffffffef8,'\0');
  }
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  std::
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  ::unordered_map((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                   *)in_stack_fffffffffffffef8);
  std::
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  ::unordered_map(in_stack_fffffffffffffef8);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffef8);
  *(undefined4 *)(in_RDI + 0x170) = 0;
  *(undefined4 *)(in_RDI + 0x20178) = 0;
  s<(char)49>();
  std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::time_point
            ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_fffffffffffffef8,(duration *)0xee3bad);
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffef8);
  *(undefined4 *)(in_RDI + 0xa01b8) = in_ECX;
  *(undefined8 *)(in_RDI + 0xa01c0) = in_RSI;
  std::
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  ::unordered_map((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                   *)in_stack_fffffffffffffef8);
  for (local_48 = (undefined8 *)(in_RDI + 0x20180); local_48 != (undefined8 *)(in_RDI + 0xa0180);
      local_48 = local_48 + 0x40) {
    for (local_68 = local_48; local_68 != local_48 + 0x40; local_68 = local_68 + 1) {
      *local_68 = 0xffffffffffffffff;
    }
  }
  for (local_88 = (undefined8 *)(in_RDI + 0x178); local_88 != (undefined8 *)(in_RDI + 0x20178);
      local_88 = local_88 + 0x40) {
    for (local_a8 = local_88; local_a8 != local_88 + 0x40; local_a8 = local_a8 + 1) {
      *local_a8 = 0xffffffffffffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AddrManImpl::AddrManImpl(const NetGroupManager& netgroupman, bool deterministic, int32_t consistency_check_ratio)
    : insecure_rand{deterministic}
    , nKey{deterministic ? uint256{1} : insecure_rand.rand256()}
    , m_consistency_check_ratio{consistency_check_ratio}
    , m_netgroupman{netgroupman}
{
    for (auto& bucket : vvNew) {
        for (auto& entry : bucket) {
            entry = -1;
        }
    }
    for (auto& bucket : vvTried) {
        for (auto& entry : bucket) {
            entry = -1;
        }
    }
}